

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVkImpl::ShaderVkImpl
          (ShaderVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pRenderDeviceVk,
          ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI,bool IsDeviceInternal)

{
  long lVar1;
  IThreadPool *pThreadPool;
  RenderDeviceInfo *pRVar2;
  CreateInfo *ShaderCI_00;
  SHADER_COMPILE_FLAGS SVar3;
  IMemoryAllocator *RawAllocator;
  anon_class_1136_8_00c597a2_for_Handler local_4c0;
  AsyncInitializer local_50;
  undefined1 local_31;
  CreateInfo *pCStack_30;
  bool IsDeviceInternal_local;
  CreateInfo *VkShaderCI_local;
  ShaderCreateInfo *ShaderCI_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  IReferenceCounters *pRefCounters_local;
  ShaderVkImpl *this_local;
  
  local_31 = IsDeviceInternal;
  pCStack_30 = VkShaderCI;
  VkShaderCI_local = (CreateInfo *)ShaderCI;
  ShaderCI_local = (ShaderCreateInfo *)pRenderDeviceVk;
  pRenderDeviceVk_local = (RenderDeviceVkImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ShaderBase<Diligent::EngineVkImplTraits>::ShaderBase
            (&this->super_ShaderBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             &ShaderCI->Desc,VkShaderCI->DeviceInfo,VkShaderCI->AdapterInfo,IsDeviceInternal);
  (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>.
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_010d46d8;
  std::shared_ptr<const_Diligent::SPIRVShaderResources>::shared_ptr(&this->m_pShaderResources);
  std::__cxx11::string::string((string *)&this->m_EntryPoint);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_SPIRV);
  std::atomic<Diligent::SHADER_STATUS>::store
            (&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status,
             SHADER_STATUS_COMPILING,memory_order_seq_cst);
  if (((pCStack_30->pCompilationThreadPool != (IThreadPool *)0x0) &&
      (SVar3 = Diligent::operator&(*(SHADER_COMPILE_FLAGS *)&VkShaderCI_local[2].ppCompilerOutput,
                                   SHADER_COMPILE_FLAG_ASYNCHRONOUS), ShaderCI_00 = VkShaderCI_local
      , SVar3 != SHADER_COMPILE_FLAG_NONE)) &&
     (lVar1._0_4_ = VkShaderCI_local->VkVersion, lVar1._4_1_ = VkShaderCI_local->HasSpirv14,
     lVar1._5_3_ = *(undefined3 *)&VkShaderCI_local->field_0x1d, lVar1 == 0)) {
    pThreadPool = pCStack_30->pCompilationThreadPool;
    local_4c0.this = this;
    RawAllocator = GetRawAllocator();
    ShaderCreateInfoWrapper::ShaderCreateInfoWrapper
              (&local_4c0.ShaderCI,(ShaderCreateInfo *)ShaderCI_00,RawAllocator);
    local_4c0.pDXCompiler = pCStack_30->pDXCompiler;
    pRVar2 = pCStack_30->DeviceInfo;
    local_4c0.DeviceInfo.MaxShaderVersion.MSL = (pRVar2->MaxShaderVersion).MSL;
    local_4c0.DeviceInfo.MaxShaderVersion.GLSL = (pRVar2->MaxShaderVersion).GLSL;
    local_4c0.DeviceInfo.MaxShaderVersion.GLESSL = (pRVar2->MaxShaderVersion).GLESSL;
    local_4c0.DeviceInfo.NDC.ZtoDepthScale = (pRVar2->NDC).ZtoDepthScale;
    local_4c0.DeviceInfo.NDC.YtoVScale = (pRVar2->NDC).YtoVScale;
    local_4c0.DeviceInfo.MaxShaderVersion.HLSL = (pRVar2->MaxShaderVersion).HLSL;
    local_4c0.DeviceInfo.Type = pRVar2->Type;
    local_4c0.DeviceInfo.APIVersion.Major = (pRVar2->APIVersion).Major;
    local_4c0.DeviceInfo._8_8_ = *(undefined8 *)&(pRVar2->APIVersion).Minor;
    local_4c0.DeviceInfo.Features.ComputeShaders = (pRVar2->Features).ComputeShaders;
    local_4c0.DeviceInfo.Features.GeometryShaders = (pRVar2->Features).GeometryShaders;
    local_4c0.DeviceInfo.Features.Tessellation = (pRVar2->Features).Tessellation;
    local_4c0.DeviceInfo.Features.MeshShaders = (pRVar2->Features).MeshShaders;
    local_4c0.DeviceInfo.Features.RayTracing = (pRVar2->Features).RayTracing;
    local_4c0.DeviceInfo.Features.BindlessResources = (pRVar2->Features).BindlessResources;
    local_4c0.DeviceInfo.Features.OcclusionQueries = (pRVar2->Features).OcclusionQueries;
    local_4c0.DeviceInfo.Features.BinaryOcclusionQueries = (pRVar2->Features).BinaryOcclusionQueries
    ;
    local_4c0.DeviceInfo.Features.TimestampQueries = (pRVar2->Features).TimestampQueries;
    local_4c0.DeviceInfo.Features.PipelineStatisticsQueries =
         (pRVar2->Features).PipelineStatisticsQueries;
    local_4c0.DeviceInfo.Features.DurationQueries = (pRVar2->Features).DurationQueries;
    local_4c0.DeviceInfo.Features.DepthBiasClamp = (pRVar2->Features).DepthBiasClamp;
    local_4c0.DeviceInfo.Features.DepthClamp = (pRVar2->Features).DepthClamp;
    local_4c0.DeviceInfo.Features.IndependentBlend = (pRVar2->Features).IndependentBlend;
    local_4c0.DeviceInfo.Features.DualSourceBlend = (pRVar2->Features).DualSourceBlend;
    local_4c0.DeviceInfo.Features.MultiViewport = (pRVar2->Features).MultiViewport;
    local_4c0.DeviceInfo.Features.TextureCompressionBC = (pRVar2->Features).TextureCompressionBC;
    local_4c0.DeviceInfo.Features.TextureCompressionETC2 = (pRVar2->Features).TextureCompressionETC2
    ;
    local_4c0.DeviceInfo.Features.VertexPipelineUAVWritesAndAtomics =
         (pRVar2->Features).VertexPipelineUAVWritesAndAtomics;
    local_4c0.DeviceInfo.Features.PixelUAVWritesAndAtomics =
         (pRVar2->Features).PixelUAVWritesAndAtomics;
    local_4c0.DeviceInfo.Features.TextureUAVExtendedFormats =
         (pRVar2->Features).TextureUAVExtendedFormats;
    local_4c0.DeviceInfo.Features.ShaderFloat16 = (pRVar2->Features).ShaderFloat16;
    local_4c0.DeviceInfo.Features.ResourceBuffer16BitAccess =
         (pRVar2->Features).ResourceBuffer16BitAccess;
    local_4c0.DeviceInfo.Features.UniformBuffer16BitAccess =
         (pRVar2->Features).UniformBuffer16BitAccess;
    local_4c0.DeviceInfo.Features.ShaderInputOutput16 = (pRVar2->Features).ShaderInputOutput16;
    local_4c0.DeviceInfo.Features.ShaderInt8 = (pRVar2->Features).ShaderInt8;
    local_4c0.DeviceInfo.Features.ResourceBuffer8BitAccess =
         (pRVar2->Features).ResourceBuffer8BitAccess;
    local_4c0.DeviceInfo.Features.UniformBuffer8BitAccess =
         (pRVar2->Features).UniformBuffer8BitAccess;
    local_4c0.DeviceInfo.Features.ShaderResourceStaticArrays =
         (pRVar2->Features).ShaderResourceStaticArrays;
    local_4c0.DeviceInfo.Features.ShaderResourceRuntimeArrays =
         (pRVar2->Features).ShaderResourceRuntimeArrays;
    local_4c0.DeviceInfo.Features.WaveOp = (pRVar2->Features).WaveOp;
    local_4c0.DeviceInfo.Features.InstanceDataStepRate = (pRVar2->Features).InstanceDataStepRate;
    local_4c0.DeviceInfo.Features.NativeFence = (pRVar2->Features).NativeFence;
    local_4c0.DeviceInfo.Features.TileShaders = (pRVar2->Features).TileShaders;
    local_4c0.DeviceInfo.Features.TransferQueueTimestampQueries =
         (pRVar2->Features).TransferQueueTimestampQueries;
    local_4c0.DeviceInfo.Features.VariableRateShading = (pRVar2->Features).VariableRateShading;
    local_4c0.DeviceInfo.Features.SparseResources = (pRVar2->Features).SparseResources;
    local_4c0.DeviceInfo.Features.SubpassFramebufferFetch =
         (pRVar2->Features).SubpassFramebufferFetch;
    local_4c0.DeviceInfo.Features.TextureComponentSwizzle =
         (pRVar2->Features).TextureComponentSwizzle;
    local_4c0.DeviceInfo.Features.TextureSubresourceViews =
         (pRVar2->Features).TextureSubresourceViews;
    local_4c0.DeviceInfo._56_8_ = *(undefined8 *)&(pRVar2->Features).NativeMultiDraw;
    memcpy(&local_4c0.AdapterInfo,pCStack_30->AdapterInfo,0x334);
    local_4c0.VkVersion = pCStack_30->VkVersion;
    local_4c0.HasSpirv14 = (bool)(pCStack_30->HasSpirv14 & 1);
    local_4c0.ppCompilerOutput = pCStack_30->ppCompilerOutput;
    AsyncInitializer::
    Start<Diligent::ShaderVkImpl::ShaderVkImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceVkImpl*,Diligent::ShaderCreateInfo_const&,Diligent::ShaderVkImpl::CreateInfo_const&,bool)::__0>
              (&local_50,pThreadPool,&local_4c0);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    operator=(&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_AsyncInitializer,
              (unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
               *)&local_50);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_50);
    ShaderVkImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceVkImpl*,Diligent::ShaderCreateInfo_const&,Diligent::ShaderVkImpl::CreateInfo_const&,bool)
    ::$_0::~__0((__0 *)&local_4c0);
    return;
  }
  Initialize(this,(ShaderCreateInfo *)VkShaderCI_local,pCStack_30);
  return;
}

Assistant:

ShaderVkImpl::ShaderVkImpl(IReferenceCounters*     pRefCounters,
                           RenderDeviceVkImpl*     pRenderDeviceVk,
                           const ShaderCreateInfo& ShaderCI,
                           const CreateInfo&       VkShaderCI,
                           bool                    IsDeviceInternal) :
    // clang-format off
    TShaderBase
    {
        pRefCounters,
        pRenderDeviceVk,
        ShaderCI.Desc,
        VkShaderCI.DeviceInfo,
        VkShaderCI.AdapterInfo,
        IsDeviceInternal
    }
// clang-format on
{
    m_Status.store(SHADER_STATUS_COMPILING);
    if (VkShaderCI.pCompilationThreadPool == nullptr || (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == 0 || ShaderCI.ByteCode != nullptr)
    {
        Initialize(ShaderCI, VkShaderCI);
    }
    else
    {
        this->m_AsyncInitializer = AsyncInitializer::Start(
            VkShaderCI.pCompilationThreadPool,
            [this,
             ShaderCI         = ShaderCreateInfoWrapper{ShaderCI, GetRawAllocator()},
             pDXCompiler      = VkShaderCI.pDXCompiler,
             DeviceInfo       = VkShaderCI.DeviceInfo,
             AdapterInfo      = VkShaderCI.AdapterInfo,
             VkVersion        = VkShaderCI.VkVersion,
             HasSpirv14       = VkShaderCI.HasSpirv14,
             ppCompilerOutput = VkShaderCI.ppCompilerOutput](Uint32 ThreadId) mutable //
            {
                try
                {
                    const CreateInfo VkShaderCI{
                        pDXCompiler,
                        DeviceInfo,
                        AdapterInfo,
                        VkVersion,
                        HasSpirv14,
                        ppCompilerOutput,
                        nullptr,
                    };
                    Initialize(ShaderCI, VkShaderCI);
                }
                catch (...)
                {
                    m_Status.store(SHADER_STATUS_FAILED);
                }
                ShaderCI = ShaderCreateInfoWrapper{};
            });
    }
}